

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O0

void __thiscall leveldb::AddBoundaryInputsTest::AddBoundaryInputsTest(AddBoundaryInputsTest *this)

{
  Comparator *c;
  AddBoundaryInputsTest *this_local;
  
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            (&this->level_files_);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            (&this->compaction_files_);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            (&this->all_files_);
  c = BytewiseComparator();
  InternalKeyComparator::InternalKeyComparator(&this->icmp_,c);
  return;
}

Assistant:

AddBoundaryInputsTest() : icmp_(BytewiseComparator()) {}